

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  *(undefined ***)&this->field_0x118 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x120 = 0;
  *(char **)&this->field_0x128 = "IfcGeometricRepresentationSubContext";
  IfcGeometricRepresentationContext::IfcGeometricRepresentationContext
            (&this->super_IfcGeometricRepresentationContext,&PTR_construction_vtable_24__009a2bc8);
  *(undefined8 *)&(this->super_IfcGeometricRepresentationContext).field_0xb0 = 0;
  *(undefined8 *)&(this->super_IfcGeometricRepresentationContext).field_0xb8 = 0;
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x9a2b38;
  *(undefined8 *)&this->field_0x118 = 0x9a2bb0;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.field_0x60 =
       0x9a2b60;
  *(undefined8 *)&(this->super_IfcGeometricRepresentationContext).field_0xa8 = 0x9a2b88;
  (this->TargetScale).have = false;
  (this->TargetView)._M_dataplus._M_p = (pointer)&(this->TargetView).field_2;
  (this->TargetView)._M_string_length = 0;
  (this->TargetView).field_2._M_local_buf[0] = '\0';
  (this->UserDefinedTargetView).ptr._M_dataplus._M_p =
       (pointer)&(this->UserDefinedTargetView).ptr.field_2;
  (this->UserDefinedTargetView).ptr._M_string_length = 0;
  (this->UserDefinedTargetView).ptr.field_2._M_local_buf[0] = '\0';
  (this->UserDefinedTargetView).have = false;
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}